

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

void __thiscall cmCTestBuildCommand::~cmCTestBuildCommand(cmCTestBuildCommand *this)

{
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestBuildCommand_005e1f20;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  }
  cmCTestHandlerCommand::~cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  return;
}

Assistant:

cmCTestBuildCommand::~cmCTestBuildCommand()
{
  if (this->GlobalGenerator) {
    delete this->GlobalGenerator;
    this->GlobalGenerator = nullptr;
  }
}